

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::Print<char>::operator()
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Print<char> *this,mode *first,char (*args) [8],char (*args_1) [16],char (*args_2) [15])

{
  int iVar1;
  conditional_t<std::is_same_v<char,_char>,_const_std::basic_string<char>_&,_std::basic_string<char>_>
  pbVar2;
  allocator<char> local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char (*local_38) [15];
  char (*args_local_2) [15];
  char (*args_local_1) [16];
  char (*args_local) [8];
  mode *first_local;
  Print<char> *this_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [15])args_1;
  args_local_1 = (char (*) [16])args;
  args_local = (char (*) [8])first;
  first_local = (mode *)this;
  this_local = (Print<char> *)__return_storage_ptr__;
  if (*first == str) {
    if (operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
        ::oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                    ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                     &operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                             ::oss_abi_cxx11_);
      }
    }
    s_abi_cxx11_(&local_68,"",0);
    anon_unknown_8::StringConverter<char>(&local_68);
    std::__cxx11::ostringstream::str
              ((string *)
               &operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                ::oss_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_68);
    std::ios::clear((int)*(undefined8 *)
                          (operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                           ::oss_abi_cxx11_ + -0x18) + 0x1b0b28);
    print_backend<std::__cxx11::ostringstream&,char_const(&)[8],char_const(&)[16],char_const(&)[15]>
              (this,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                     ::oss_abi_cxx11_,(char (*) [8])args_local_1,(char (*) [16])args_local_2,
               local_38);
    std::__cxx11::ostringstream::str();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
    pbVar2 = anon_unknown_8::StringConverter<char>(&local_88);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }